

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall
soplex::LPColSetBase<double>::add(LPColSetBase<double> *this,DataKey *pkey,LPColBase<double> *pcol)

{
  LPColBase<double> *in_RDX;
  double *in_stack_00000018;
  SVectorBase<double> *in_stack_00000020;
  double *in_stack_00000028;
  double *in_stack_00000030;
  DataKey *in_stack_00000038;
  
  LPColBase<double>::obj(in_RDX);
  LPColBase<double>::lower(in_RDX);
  LPColBase<double>::colVector(in_RDX);
  LPColBase<double>::upper(in_RDX);
  add((LPColSetBase<double> *)pcol,in_stack_00000038,in_stack_00000030,in_stack_00000028,
      in_stack_00000020,in_stack_00000018,(int *)this);
  return;
}

Assistant:

void add(DataKey& pkey, const LPColBase<R>& pcol)
   {
      add(pkey, pcol.obj(), pcol.lower(), pcol.colVector(), pcol.upper());
   }